

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,REF_INT e0,REF_INT e1)

{
  uint uVar1;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  pRVar2 = ref_subdiv->grid;
  pRVar3 = pRVar2->node;
  pRVar4 = ref_subdiv->edge->e2n;
  uVar1 = pRVar4[e0 * 2];
  lVar13 = (long)(int)uVar1;
  lVar9 = -1;
  if ((-1 < lVar13) && ((int)uVar1 < pRVar3->max)) {
    lVar9 = -1;
    if (-1 < pRVar3->global[lVar13]) {
      lVar9 = pRVar3->global[lVar13];
    }
  }
  uVar12 = pRVar4[(int)(e0 * 2 | 1)];
  lVar7 = (long)(int)uVar12;
  lVar15 = -1;
  if ((-1 < lVar7) && ((int)uVar12 < pRVar3->max)) {
    lVar15 = -1;
    if (-1 < pRVar3->global[lVar7]) {
      lVar15 = pRVar3->global[lVar7];
    }
  }
  if (lVar9 < lVar15) {
    lVar9 = -1;
    if ((-1 < (int)uVar1) && (uVar11 = uVar1, (int)uVar1 < pRVar3->max)) {
LAB_0020cbd5:
      lVar9 = -1;
      if (-1 < pRVar3->global[uVar11]) {
        lVar9 = pRVar3->global[uVar11];
      }
    }
  }
  else {
    lVar9 = -1;
    if ((-1 < (int)uVar12) && (uVar11 = uVar12, (int)uVar12 < pRVar3->max)) goto LAB_0020cbd5;
  }
  lVar15 = -1;
  if ((-1 < (int)uVar1) && ((int)uVar1 < pRVar3->max)) {
    lVar15 = -1;
    if (-1 < pRVar3->global[lVar13]) {
      lVar15 = pRVar3->global[lVar13];
    }
  }
  lVar13 = -1;
  if ((-1 < (int)uVar12) && ((int)uVar12 < pRVar3->max)) {
    lVar13 = -1;
    if (-1 < pRVar3->global[lVar7]) {
      lVar13 = pRVar3->global[lVar7];
    }
  }
  if (lVar13 < lVar15) {
    lVar13 = -1;
    if ((-1 < (int)uVar1) && (uVar12 = uVar1, (int)uVar1 < pRVar3->max)) {
LAB_0020cc68:
      lVar13 = -1;
      if (-1 < pRVar3->global[uVar12]) {
        lVar13 = pRVar3->global[uVar12];
      }
    }
  }
  else {
    lVar13 = -1;
    if ((-1 < (int)uVar12) && ((int)uVar12 < pRVar3->max)) goto LAB_0020cc68;
  }
  uVar1 = pRVar4[e1 * 2];
  lVar14 = (long)(int)uVar1;
  lVar15 = -1;
  lVar7 = -1;
  if ((-1 < lVar14) && ((int)uVar1 < pRVar3->max)) {
    lVar7 = -1;
    if (-1 < pRVar3->global[lVar14]) {
      lVar7 = pRVar3->global[lVar14];
    }
  }
  uVar12 = pRVar4[(int)(e1 * 2 | 1)];
  lVar8 = (long)(int)uVar12;
  if (((-1 < lVar8) && ((int)uVar12 < pRVar3->max)) && (-1 < pRVar3->global[lVar8])) {
    lVar15 = pRVar3->global[lVar8];
  }
  lVar10 = -1;
  if (lVar7 < lVar15) {
    if ((-1 < (int)uVar1) && (uVar11 = uVar1, (int)uVar1 < pRVar3->max)) {
LAB_0020cd04:
      lVar10 = -1;
      if (-1 < pRVar3->global[uVar11]) {
        lVar10 = pRVar3->global[uVar11];
      }
    }
  }
  else if ((-1 < (int)uVar12) && (uVar11 = uVar12, (int)uVar12 < pRVar3->max)) goto LAB_0020cd04;
  lVar15 = -1;
  if ((-1 < (int)uVar1) && ((int)uVar1 < pRVar3->max)) {
    lVar15 = -1;
    if (-1 < pRVar3->global[lVar14]) {
      lVar15 = pRVar3->global[lVar14];
    }
  }
  lVar7 = -1;
  if ((-1 < (int)uVar12) && ((int)uVar12 < pRVar3->max)) {
    lVar7 = -1;
    if (-1 < pRVar3->global[lVar8]) {
      lVar7 = pRVar3->global[lVar8];
    }
  }
  if (lVar7 < lVar15) {
    lVar15 = -1;
    if (((int)uVar1 < 0) || (uVar12 = uVar1, pRVar3->max <= (int)uVar1)) goto LAB_0020cda9;
  }
  else {
    lVar15 = -1;
    if (((int)uVar12 < 0) || (pRVar3->max <= (int)uVar12)) goto LAB_0020cda9;
  }
  lVar15 = -1;
  if (-1 < pRVar3->global[uVar12]) {
    lVar15 = pRVar3->global[uVar12];
  }
LAB_0020cda9:
  bVar5 = lVar9 < lVar10;
  if (lVar9 == lVar10) {
    bVar5 = lVar13 < lVar15;
  }
  if (bVar5) {
    e0 = e1;
  }
  ref_subdiv->mark[e0] = 0;
  if (ref_subdiv->debug == 0) {
    return (REF_STATUS)pRVar2;
  }
  iVar6 = printf("unmark one of two proc %d edges %d %d\n",(ulong)(uint)pRVar2->mpi->id);
  return iVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,
                                                       REF_INT e0, REF_INT e1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_GLOB e0min, e0max;
  REF_GLOB e1min, e1max;

  /* unmark the edge with the smallest edge globals */
  e0min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e0max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e1min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  e1max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  if (e0min == e1min) {
    if (e0max < e1max) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  } else {
    if (e0min < e1min) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  }

  if (ref_subdiv->debug)
    printf("unmark one of two proc %d edges %d %d\n",
           ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), e0, e1);

  return REF_SUCCESS;
}